

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O0

void __thiscall wabt::anon_unknown_0::CWriter::WriteMemories(CWriter *this)

{
  string_view name;
  bool bVar1;
  size_type sVar2;
  vector<wabt::Memory_*,_std::allocator<wabt::Memory_*>_> *this_00;
  reference ppMVar3;
  string local_60;
  undefined1 local_39;
  Memory *pMStack_38;
  bool is_import;
  Memory *memory;
  const_iterator __end2;
  const_iterator __begin2;
  vector<wabt::Memory_*,_std::allocator<wabt::Memory_*>_> *__range2;
  Index memory_index;
  CWriter *this_local;
  
  sVar2 = std::vector<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>::size
                    (&this->module_->memories);
  if (sVar2 != this->module_->num_memory_imports) {
    __range2._4_4_ = 0;
    this_00 = &this->module_->memories;
    __end2 = std::vector<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>::begin(this_00);
    memory = (Memory *)std::vector<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>::end(this_00);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<wabt::Memory_*const_*,_std::vector<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>_>
                                       *)&memory), bVar1) {
      ppMVar3 = __gnu_cxx::
                __normal_iterator<wabt::Memory_*const_*,_std::vector<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>_>
                ::operator*(&__end2);
      pMStack_38 = *ppMVar3;
      local_39 = __range2._4_4_ < this->module_->num_memory_imports;
      if (!(bool)local_39) {
        name = (string_view)
               std::__cxx11::string::operator_cast_to_basic_string_view((string *)pMStack_38);
        (anonymous_namespace)::CWriter::DefineInstanceMemberName_abi_cxx11_
                  (&local_60,(CWriter *)this,Memory,name);
        WriteMemory(this,&local_60);
        std::__cxx11::string::~string((string *)&local_60);
        Write(this);
      }
      __range2._4_4_ = __range2._4_4_ + 1;
      __gnu_cxx::
      __normal_iterator<wabt::Memory_*const_*,_std::vector<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>_>
      ::operator++(&__end2);
    }
  }
  return;
}

Assistant:

void CWriter::WriteMemories() {
  if (module_->memories.size() == module_->num_memory_imports)
    return;

  Index memory_index = 0;
  for (const Memory* memory : module_->memories) {
    bool is_import = memory_index < module_->num_memory_imports;
    if (!is_import) {
      WriteMemory(
          DefineInstanceMemberName(ModuleFieldType::Memory, memory->name));
      Write(Newline());
    }
    ++memory_index;
  }
}